

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_post_write_tile
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  opj_tcd_t *p_tile_coder;
  OPJ_UINT32 OVar2;
  OPJ_BOOL OVar3;
  OPJ_SIZE_T OVar4;
  OPJ_BYTE *pOVar5;
  OPJ_UINT32 OVar6;
  ulong uVar7;
  opj_stream_private_t *poVar8;
  opj_event_mgr_t *poVar9;
  OPJ_UINT32 OVar10;
  uint uVar11;
  int iVar12;
  OPJ_BYTE *p_data;
  OPJ_UINT32 OVar13;
  opj_j2k_t *p_j2k_00;
  ulong uVar14;
  OPJ_UINT32 local_8c;
  OPJ_UINT32 local_88;
  uint local_84;
  uint local_80;
  OPJ_UINT32 local_7c;
  opj_j2k_t *local_78;
  OPJ_BYTE *local_70;
  ulong local_68;
  opj_cp_t *local_60;
  opj_stream_private_t *local_58;
  OPJ_UINT32 *local_50;
  opj_tcp_t *local_48;
  opj_tcd *local_40;
  opj_event_mgr_t *local_38;
  
  pOVar5 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
  if (pOVar5 == (OPJ_BYTE *)0x0) {
    __assert_fail("p_j2k->m_specific_param.m_encoder.m_encoded_tile_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x2d03,
                  "OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar6 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size;
  p_tile_coder = p_j2k->m_tcd;
  p_tile_coder->cur_pino = 0;
  (p_j2k->m_specific_param).m_decoder.m_state = 0;
  local_88 = 0;
  local_58 = p_stream;
  OVar3 = opj_j2k_write_sot(p_j2k,pOVar5,OVar6,&local_88,p_stream,p_manager);
  if (OVar3 != 0) {
    local_60 = &p_j2k->m_cp;
    local_68 = (ulong)local_88;
    p_data = pOVar5 + local_68;
    OVar10 = OVar6 - local_88;
    local_78 = p_j2k;
    local_70 = pOVar5;
    if ((3 < (ushort)((short)*(undefined4 *)local_60 - 3U)) &&
       ((p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].numpocs != 0)) {
      local_88 = 0;
      opj_j2k_write_poc_in_memory(p_j2k,p_data,&local_88,p_manager);
      p_data = p_data + local_88;
      OVar10 = OVar10 - local_88;
      local_68 = (ulong)((int)local_68 + local_88);
    }
    p_j2k_00 = local_78;
    local_88 = 0;
    OVar3 = opj_j2k_write_sod(local_78,p_tile_coder,p_data,&local_88,OVar10,local_58,p_manager);
    if (OVar3 != 0) {
      uVar11 = (int)local_68 + local_88;
      opj_write_bytes_LE(local_70 + 6,uVar11,4);
      if ((ushort)((short)*(undefined4 *)local_60 - 3U) < 4) {
        opj_j2k_update_tlm(p_j2k_00,uVar11);
      }
      pOVar5 = local_70 + uVar11;
      OVar6 = OVar6 - uVar11;
      local_40 = p_j2k_00->m_tcd;
      local_48 = (p_j2k_00->m_cp).tcps;
      local_50 = (OPJ_UINT32 *)(ulong)p_j2k_00->m_current_tile_number;
      iVar12 = 0;
      local_68 = (ulong)uVar11;
      local_84 = opj_j2k_get_num_tp(local_60,0,p_j2k_00->m_current_tile_number);
      pOVar1 = &(p_j2k_00->m_specific_param).m_encoder.m_current_tile_part_number;
      *pOVar1 = *pOVar1 + 1;
      uVar11 = 1;
      local_38 = p_manager;
      while( true ) {
        poVar9 = local_38;
        poVar8 = local_58;
        if (local_84 <= uVar11) {
          local_50 = &local_48[(long)local_50].numpocs;
          uVar11 = 1;
          do {
            if (*local_50 < uVar11) {
              uVar7 = (ulong)(uint)((int)local_68 + iVar12);
              OVar4 = opj_stream_write_data
                                (poVar8,(p_j2k_00->m_specific_param).m_encoder.m_encoded_tile_data,
                                 uVar7,poVar9);
              if (OVar4 == uVar7) {
                p_j2k_00->m_current_tile_number = p_j2k_00->m_current_tile_number + 1;
                return 1;
              }
              return 0;
            }
            local_40->cur_pino = uVar11;
            local_48 = (opj_tcp_t *)CONCAT44(local_48._4_4_,uVar11);
            local_84 = opj_j2k_get_num_tp(local_60,uVar11,p_j2k_00->m_current_tile_number);
            uVar11 = 0;
            while (local_84 != uVar11) {
              local_70 = (OPJ_BYTE *)CONCAT44(local_70._4_4_,iVar12);
              (p_j2k_00->m_specific_param).m_decoder.m_state = uVar11;
              local_8c = 0;
              local_80 = uVar11;
              OVar3 = opj_j2k_write_sot(p_j2k_00,pOVar5,OVar6,&local_8c,poVar8,poVar9);
              OVar10 = local_8c;
              if (OVar3 == 0) {
                return 0;
              }
              uVar7 = (ulong)local_8c;
              OVar6 = OVar6 - local_8c;
              local_8c = 0;
              OVar3 = opj_j2k_write_sod(p_j2k_00,local_40,pOVar5 + uVar7,&local_8c,OVar6,poVar8,
                                        poVar9);
              OVar2 = local_8c;
              if (OVar3 == 0) {
                return 0;
              }
              uVar14 = (ulong)local_8c;
              OVar13 = local_8c + OVar10;
              local_7c = OVar6;
              opj_write_bytes_LE(pOVar5 + 6,OVar13,4);
              if ((ushort)((short)*(undefined4 *)local_60 - 3U) < 4) {
                opj_j2k_update_tlm(local_78,OVar13);
              }
              iVar12 = (int)local_70 + OVar10 + OVar2;
              pOVar1 = &(local_78->m_specific_param).m_encoder.m_current_tile_part_number;
              *pOVar1 = *pOVar1 + 1;
              pOVar5 = pOVar5 + uVar7 + uVar14;
              OVar6 = local_7c - OVar2;
              poVar8 = local_58;
              poVar9 = local_38;
              p_j2k_00 = local_78;
              uVar11 = local_80 + 1;
            }
            uVar11 = (int)local_48 + 1;
          } while( true );
        }
        local_70 = (OPJ_BYTE *)CONCAT44(local_70._4_4_,iVar12);
        (p_j2k_00->m_specific_param).m_decoder.m_state = uVar11;
        local_8c = 0;
        local_80 = uVar11;
        OVar3 = opj_j2k_write_sot(p_j2k_00,pOVar5,OVar6,&local_8c,local_58,local_38);
        OVar10 = local_8c;
        if (OVar3 == 0) break;
        uVar7 = (ulong)local_8c;
        OVar6 = OVar6 - local_8c;
        local_8c = 0;
        OVar3 = opj_j2k_write_sod(p_j2k_00,local_40,pOVar5 + uVar7,&local_8c,OVar6,poVar8,poVar9);
        OVar2 = local_8c;
        if (OVar3 == 0) {
          return 0;
        }
        uVar14 = (ulong)local_8c;
        OVar13 = local_8c + OVar10;
        local_7c = OVar6;
        opj_write_bytes_LE(pOVar5 + 6,OVar13,4);
        if ((ushort)((short)*(undefined4 *)local_60 - 3U) < 4) {
          opj_j2k_update_tlm(local_78,OVar13);
        }
        pOVar5 = pOVar5 + uVar7 + uVar14;
        pOVar1 = &(local_78->m_specific_param).m_encoder.m_current_tile_part_number;
        *pOVar1 = *pOVar1 + 1;
        iVar12 = (int)local_70 + OVar10 + OVar2;
        OVar6 = local_7c - OVar2;
        uVar11 = local_80 + 1;
        p_j2k_00 = local_78;
      }
    }
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t * p_j2k,
                                        opj_stream_private_t *p_stream,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_nb_bytes_written;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_available_data;

    /* preconditions */
    assert(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);

    l_tile_size = p_j2k->m_specific_param.m_encoder.m_encoded_tile_size;
    l_available_data = l_tile_size;
    l_current_data = p_j2k->m_specific_param.m_encoder.m_encoded_tile_data;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_first_tile_part(p_j2k, l_current_data, &l_nb_bytes_written,
                                        l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }
    l_current_data += l_nb_bytes_written;
    l_available_data -= l_nb_bytes_written;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_all_tile_parts(p_j2k, l_current_data, &l_nb_bytes_written,
                                       l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_available_data -= l_nb_bytes_written;
    l_nb_bytes_written = l_tile_size - l_available_data;

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_encoded_tile_data,
                              l_nb_bytes_written, p_manager) != l_nb_bytes_written) {
        return OPJ_FALSE;
    }

    ++p_j2k->m_current_tile_number;

    return OPJ_TRUE;
}